

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Cord __thiscall
google::protobuf::Reflection::GetCord(Reflection *this,Message *message,FieldDescriptor *field)

{
  void *pvVar1;
  bool bVar2;
  CppStringType CVar3;
  uint32_t uVar4;
  OneofDescriptor *pOVar5;
  Cord **ppCVar6;
  string *psVar7;
  ArenaStringPtr *pAVar8;
  Cord *src;
  FieldDescriptor *in_RCX;
  char *description;
  undefined8 extraout_RDX;
  undefined8 uVar9;
  undefined8 extraout_RDX_00;
  Descriptor *pDVar10;
  Metadata MVar11;
  Cord CVar12;
  string_view src_00;
  
  MVar11 = Message::GetMetadata((Message *)field);
  if (MVar11.reflection != (Reflection *)message) {
    pDVar10 = (Descriptor *)(message->super_MessageLite)._vptr_MessageLite;
    MVar11 = Message::GetMetadata((Message *)field);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar10,MVar11.descriptor,in_RCX,"GetCord");
  }
  pDVar10 = (Descriptor *)(message->super_MessageLite)._vptr_MessageLite;
  if (in_RCX->containing_type_ != pDVar10) {
    description = "Field does not match message type.";
LAB_0025234c:
    anon_unknown_6::ReportReflectionUsageError(pDVar10,in_RCX,"GetCord",description);
  }
  bVar2 = FieldDescriptor::is_repeated(in_RCX);
  if (bVar2) {
    pDVar10 = (Descriptor *)(message->super_MessageLite)._vptr_MessageLite;
    description = "Field is repeated; the method requires a singular field.";
    goto LAB_0025234c;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)in_RCX->type_ * 4) != 9) {
    anon_unknown_6::ReportReflectionUsageTypeError
              ((Descriptor *)(message->super_MessageLite)._vptr_MessageLite,in_RCX,"GetCord",
               CPPTYPE_STRING);
  }
  if ((in_RCX->field_0x1 & 8) == 0) {
    pOVar5 = FieldDescriptor::real_containing_oneof(in_RCX);
    if (pOVar5 == (OneofDescriptor *)0x0) {
LAB_00252237:
      CVar3 = FieldDescriptor::cpp_string_type(in_RCX);
      if ((CVar3 != kView) && (CVar3 != kString)) {
        if (CVar3 != kCord) {
          internal::Unreachable
                    ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x7d3);
        }
        pOVar5 = FieldDescriptor::real_containing_oneof(in_RCX);
        if (pOVar5 == (OneofDescriptor *)0x0) {
          src = GetRaw<absl::lts_20250127::Cord>((Reflection *)message,(Message *)field,in_RCX);
        }
        else {
          ppCVar6 = GetRaw<absl::lts_20250127::Cord*>((Reflection *)message,(Message *)field,in_RCX)
          ;
          src = *ppCVar6;
        }
        absl::lts_20250127::Cord::InlineRep::InlineRep((InlineRep *)this,&src->contents_);
        uVar9 = extraout_RDX_00;
        goto LAB_002522e8;
      }
      bVar2 = internal::ReflectionSchema::IsFieldInlined
                        ((ReflectionSchema *)&(message->super_MessageLite)._internal_metadata_,
                         in_RCX);
      if (bVar2) {
        psVar7 = (string *)
                 GetRaw<google::protobuf::internal::InlinedStringField>
                           ((Reflection *)message,(Message *)field,in_RCX);
      }
      else {
        pAVar8 = GetRaw<google::protobuf::internal::ArenaStringPtr>
                           ((Reflection *)message,(Message *)field,in_RCX);
        pvVar1 = (pAVar8->tagged_ptr_).ptr_;
        if (((ulong)pvVar1 & 3) == 0) goto LAB_002522d5;
        psVar7 = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
      }
    }
    else {
      bVar2 = HasOneofField((Reflection *)message,(Message *)field,in_RCX);
      if (bVar2) goto LAB_00252237;
LAB_002522d5:
      psVar7 = (in_RCX->field_20).default_value_string_;
    }
  }
  else {
    uVar4 = internal::ReflectionSchema::GetExtensionSetOffset
                      ((ReflectionSchema *)&(message->super_MessageLite)._internal_metadata_);
    psVar7 = internal::ExtensionSet::GetString
                       ((ExtensionSet *)(&field->super_SymbolBase + uVar4),in_RCX->number_,
                        (in_RCX->field_20).default_value_string_);
  }
  src_00._M_str = (psVar7->_M_dataplus)._M_p;
  src_00._M_len = psVar7->_M_string_length;
  absl::lts_20250127::Cord::Cord((Cord *)this,src_00);
  uVar9 = extraout_RDX;
LAB_002522e8:
  CVar12.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)uVar9;
  CVar12.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar12.contents_.data_.rep_.field_0;
}

Assistant:

absl::Cord Reflection::GetCord(const Message& message,
                               const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetCord, SINGULAR, STRING);
  if (field->is_extension()) {
    return absl::Cord(GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field)));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return absl::Cord(field->default_value_string());
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          return *GetField<absl::Cord*>(message, field);
        } else {
          return GetField<absl::Cord>(message, field);
        }
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return absl::Cord(
              GetField<InlinedStringField>(message, field).GetNoArena());
        } else if (IsMicroString(field)) {
          return absl::Cord(GetField<MicroString>(message, field).Get());
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return absl::Cord(str.IsDefault() ? field->default_value_string()
                                            : str.Get());
        }
    }
    internal::Unreachable();
  }
}